

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.cpp
# Opt level: O2

ostream * __thiscall Al::internal::ProgressEngine::dump_state(ProgressEngine *this,ostream *ss)

{
  _Hash_node_base *p_Var1;
  _Hash_node_base *p_Var2;
  _Hash_node_base *p_Var3;
  ostream *poVar4;
  long lVar5;
  __node_base *p_Var6;
  long lVar7;
  string local_70 [32];
  string local_50 [32];
  
  p_Var6 = &(this->run_queues)._M_h._M_before_begin;
  while (p_Var6 = p_Var6->_M_nxt, p_Var6 != (__node_base *)0x0) {
    poVar4 = std::operator<<(ss,"Pipelined run queue for stream ");
    poVar4 = std::ostream::_M_insert<void_const*>(poVar4);
    std::operator<<(poVar4,":\n");
    for (lVar5 = 0; lVar5 != 2; lVar5 = lVar5 + 1) {
      p_Var1 = p_Var6[lVar5 * 3 + 3]._M_nxt;
      p_Var2 = p_Var6[lVar5 * 3 + 2]._M_nxt;
      poVar4 = std::operator<<(ss,"Stage ");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      poVar4 = std::operator<<(poVar4," run queue (");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::operator<<(poVar4,"):\n");
      for (lVar7 = 0; (long)p_Var1 - (long)p_Var2 >> 3 != lVar7; lVar7 = lVar7 + 1) {
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)ss);
        std::operator<<(poVar4,": ");
        p_Var3 = p_Var6[lVar5 * 3 + 2]._M_nxt[lVar7]._M_nxt;
        if (p_Var3 == (_Hash_node_base *)0x0) {
          std::operator<<(ss,"(unknown)\n");
        }
        else {
          (*(code *)p_Var3->_M_nxt[6]._M_nxt)(local_70);
          poVar4 = std::operator<<(ss,local_70);
          poVar4 = std::operator<<(poVar4," ");
          (*(code *)(p_Var6[lVar5 * 3 + 2]._M_nxt[lVar7]._M_nxt)->_M_nxt[7]._M_nxt)(local_50);
          poVar4 = std::operator<<(poVar4,local_50);
          std::operator<<(poVar4,"\n");
          std::__cxx11::string::~string(local_50);
          std::__cxx11::string::~string(local_70);
        }
      }
    }
  }
  return ss;
}

Assistant:

std::ostream& ProgressEngine::dump_state(std::ostream& ss) {
  // Note: This pulls *directly from internal state*.
  // This is *not* thread safe, and stuff might blow up.
  // You should only be dumping state where you don't care about that anyway.
  for (auto&& stream_pipeline_pair : run_queues) {
    ss << "Pipelined run queue for stream " << stream_pipeline_pair.first << ":\n";
    auto&& pipeline = stream_pipeline_pair.second;
    for (size_t stage = 0; stage < AL_PE_NUM_PIPELINE_STAGES; ++stage) {
      const size_t stage_queue_size = pipeline[stage].size();
      ss << "Stage " << stage << " run queue (" << stage_queue_size << "):\n";
      for (size_t i = 0; i < stage_queue_size; ++i) {
        ss << i << ": ";
        if (pipeline[stage][i]) {
          ss << pipeline[stage][i]->get_name() << " "
             << pipeline[stage][i]->get_desc() << "\n";
        } else {
          ss << "(unknown)\n";
        }
      }
    }
  }
  return ss;
}